

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDirectDemo_ls.c
# Opt level: O0

void PrintOutput2(sunrealtype t,sunrealtype erm,int qu,sunrealtype hu)

{
  uint in_EDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  
  printf("%10.3f  %12.4e   %2d   %12.4e\n",in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa,(ulong)in_EDI);
  return;
}

Assistant:

static void PrintOutput2(sunrealtype t, sunrealtype erm, int qu, sunrealtype hu)
{
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("%10.3Lf  %12.4Le   %2d   %12.4Le\n", t, erm, qu, hu);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("%10.3f  %12.4e   %2d   %12.4e\n", t, erm, qu, hu);
#else
  printf("%10.3f  %12.4e   %2d   %12.4e\n", t, erm, qu, hu);
#endif

  return;
}